

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

void __thiscall r_exec::InputLessPGMOverlay::reset(InputLessPGMOverlay *this)

{
  vector<r_code::Atom,_std::allocator<r_code::Atom>_> *this_00;
  InputLessPGMOverlay *this_local;
  
  Overlay::reset(&this->super_Overlay);
  patch_tpl_args(this);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear
            (&(this->super_Overlay).patch_indices);
  (this->super_Overlay).value_commit_index = 0;
  this_00 = r_code::vector<r_code::Atom>::as_std(&(this->super_Overlay).values);
  std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::clear(this_00);
  std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::clear
            (&this->productions);
  return;
}

Assistant:

inline void InputLessPGMOverlay::reset()
{
    Overlay::reset();
    patch_tpl_args();
    patch_indices.clear();
    value_commit_index = 0;
    values.as_std()->clear();
    productions.clear();
}